

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O3

_Bool store_sell(store_context *ctx)

{
  store *store;
  _Bool _Var1;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  wchar_t amt;
  wchar_t wVar2;
  command_conflict *pcVar3;
  char *pmt;
  cmd_code c;
  char *pcVar4;
  code *tester;
  object *obj;
  object object_type_body;
  char o_name [120];
  object *local_1f8;
  object local_1f0;
  char local_a8 [120];
  
  store = ctx->store;
  memcpy(&local_1f0,&DAT_00243310,0x148);
  if (store == (store *)0x0) {
    __assert_fail("store",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-store.c"
                  ,0x1f8,"_Bool store_sell(struct store_context *)");
  }
  pcVar4 = "Sell which item? ";
  if ((player->opts).opt[0x25] != false) {
    pcVar4 = "Give which item? ";
  }
  msg_flag = false;
  tester = (item_tester)0x0;
  prt("",L'\0',L'\0');
  _Var1 = store_is_home(store);
  if (!_Var1) {
    tester = store_will_buy_tester;
  }
  pmt = "Drop which item? ";
  if (!_Var1) {
    pmt = pcVar4;
  }
  player->upkeep->command_wrk = L'\x02';
  _Var1 = get_item(&local_1f8,pmt,"You have nothing that I want. ",CMD_DROP,tester,
                   (uint)!_Var1 << 5 | 0xf);
  if (!_Var1) {
    return _Var1;
  }
  _Var1 = object_is_equipped(player->body,local_1f8);
  if ((!_Var1) || (_Var1 = obj_can_takeoff(local_1f8), _Var1)) {
    amt = get_quantity((char *)0x0,(uint)local_1f8->number);
    if (amt < L'\x01') {
      return (_Bool)(char)amt;
    }
    object_copy_amt(&local_1f0,local_1f8,amt);
    _Var1 = store_check_num(store,&local_1f0);
    if (_Var1) {
      object_desc(local_a8,0x78,&local_1f0,0x43,player);
      _Var1 = store_is_home(store);
      if (_Var1) {
        object_wipe(&local_1f0);
        c = CMD_STASH;
      }
      else {
        wVar2 = price_item(store,&local_1f0,true,amt);
        object_wipe(&local_1f0);
        screen_save();
        if ((player->opts).opt[0x25] == false) {
          pcVar4 = format("Price: %ld",(long)wVar2);
          prt(pcVar4,L'\x01',L'\0');
          pcVar4 = "Sell";
          if (((player->opts).opt[0x25] & 1U) != 0) {
            pcVar4 = "Give";
          }
        }
        else {
          pcVar4 = "Give";
        }
        pcVar4 = format("%s %s? [ESC, any other key to accept]",pcVar4,local_a8);
        _Var1 = store_get_check(pcVar4);
        screen_load();
        if (!_Var1) {
          return (_Bool)extraout_AL_00;
        }
        c = CMD_SELL;
      }
      cmdq_push(c);
      pcVar3 = cmdq_peek();
      cmd_set_arg_item(pcVar3,"item",local_1f8);
      pcVar3 = cmdq_peek();
      cmd_set_arg_number(pcVar3,"quantity",amt);
      *(byte *)&ctx->flags = (byte)ctx->flags | 1;
      return (_Bool)extraout_AL_01;
    }
    object_wipe(&local_1f0);
    _Var1 = store_is_home(store);
    if (_Var1) {
      pcVar4 = "Your home is full.";
    }
    else {
      pcVar4 = "I have not the room in my store to keep it.";
    }
  }
  else {
    pcVar4 = "Hmmm, it seems to be stuck.";
  }
  msg(pcVar4);
  return (_Bool)extraout_AL;
}

Assistant:

static bool store_sell(struct store_context *ctx)
{
	int amt;
	int get_mode = USE_EQUIP | USE_INVEN | USE_FLOOR | USE_QUIVER;

	struct store *store = ctx->store;

	struct object *obj;
	struct object object_type_body = OBJECT_NULL;
	struct object *temp_obj = &object_type_body;

	char o_name[120];

	item_tester tester = NULL;

	const char *reject = "You have nothing that I want. ";
	const char *prompt = OPT(player, birth_no_selling) ? "Give which item? " : "Sell which item? ";

	assert(store);

	/* Clear all current messages */
	msg_flag = false;
	prt("", 0, 0);

	if (store_is_home(store)) {
		prompt = "Drop which item? ";
	} else {
		tester = store_will_buy_tester;
		get_mode |= SHOW_PRICES;
	}

	/* Get an item */
	player->upkeep->command_wrk = USE_INVEN;

	if (!get_item(&obj, prompt, reject, CMD_DROP, tester, get_mode))
		return false;

	/* Cannot remove stickied objects */
	if (object_is_equipped(player->body, obj) && !obj_can_takeoff(obj)) {
		/* Oops */
		msg("Hmmm, it seems to be stuck.");

		/* Nope */
		return false;
	}

	/* Get a quantity */
	amt = get_quantity(NULL, obj->number);

	/* Allow user abort */
	if (amt <= 0) return false;

	/* Get a copy of the object representing the number being sold */
	object_copy_amt(temp_obj, obj, amt);

	if (!store_check_num(store, temp_obj)) {
		object_wipe(temp_obj);
		if (store_is_home(store))
			msg("Your home is full.");
		else
			msg("I have not the room in my store to keep it.");

		return false;
	}

	/* Get a full description */
	object_desc(o_name, sizeof(o_name), temp_obj,
		ODESC_PREFIX | ODESC_FULL, player);

	/* Real store */
	if (!store_is_home(store)) {
		/* Extract the value of the items */
		int32_t price = price_item(store, temp_obj, true, amt);

		object_wipe(temp_obj);
		screen_save();

		/* Show price */
		if (!OPT(player, birth_no_selling))
			prt(format("Price: %ld", (long)price), 1, 0);

		/* Confirm sale */
		if (!store_get_check(format("%s %s? [ESC, any other key to accept]",
				OPT(player, birth_no_selling) ? "Give" : "Sell", o_name))) {
			screen_load();
			return false;
		}

		screen_load();

		cmdq_push(CMD_SELL);
		cmd_set_arg_item(cmdq_peek(), "item", obj);
		cmd_set_arg_number(cmdq_peek(), "quantity", amt);
	} else { /* Player is at home */
		object_wipe(temp_obj);
		cmdq_push(CMD_STASH);
		cmd_set_arg_item(cmdq_peek(), "item", obj);
		cmd_set_arg_number(cmdq_peek(), "quantity", amt);
	}

	/* Update the display */
	ctx->flags |= STORE_GOLD_CHANGE;

	return true;
}